

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.h
# Opt level: O0

void __thiscall SVGChart::LinTickIterator::~LinTickIterator(LinTickIterator *this)

{
  LinTickIterator *this_local;
  
  ~LinTickIterator(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

LinTickIterator ():mCurrentTick (0), mDelta (0){}